

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O1

handle * __thiscall pybind11::handle::inc_ref(handle *this)

{
  PyObject *pPVar1;
  int iVar2;
  long *plVar3;
  string local_38;
  
  plVar3 = (long *)__tls_get_addr(&PTR_00149d18);
  *plVar3 = *plVar3 + 1;
  if (this->m_ptr != (PyObject *)0x0) {
    iVar2 = PyGILState_Check();
    if (iVar2 == 0) {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"pybind11::handle::inc_ref()","");
      throw_gilstate_error(this,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
  }
  pPVar1 = this->m_ptr;
  if (pPVar1 != (PyObject *)0x0) {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
  }
  return this;
}

Assistant:

const handle &inc_ref() const & {
#ifdef PYBIND11_HANDLE_REF_DEBUG
        inc_ref_counter(1);
#endif
#ifdef PYBIND11_ASSERT_GIL_HELD_INCREF_DECREF
        if (m_ptr != nullptr && !PyGILState_Check()) {
            throw_gilstate_error("pybind11::handle::inc_ref()");
        }
#endif
        Py_XINCREF(m_ptr);
        return *this;
    }